

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O0

int32_t uprv_uint32Comparator_63(void *context,void *left,void *right)

{
  uint32_t r;
  uint32_t l;
  void *right_local;
  void *left_local;
  void *context_local;
  
  if (*left < *right) {
    context_local._4_4_ = -1;
  }
  else if (*left == *right) {
    context_local._4_4_ = 0;
  }
  else {
    context_local._4_4_ = 1;
  }
  return context_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_uint32Comparator(const void *context, const void *left, const void *right) {
    (void)context;
    uint32_t l=*(const uint32_t *)left, r=*(const uint32_t *)right;

    /* compare directly because (l-r) would overflow the int32_t result */
    if(l<r) {
        return -1;
    } else if(l==r) {
        return 0;
    } else /* l>r */ {
        return 1;
    }
}